

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int find_stream_on_goaway_func(void *entry,void *ptr)

{
  int iVar1;
  
  iVar1 = *(int *)((long)entry + 0xa8);
  if ((iVar1 == 0) || (((*(char *)(*ptr + 0xb1c) == '\0' ^ (byte)iVar1) & 1) != 0)) {
    if (*(int *)((long)ptr + 0x14) == 0) {
      return 0;
    }
  }
  else if (*(int *)((long)ptr + 0x14) != 0) {
    return 0;
  }
  if (((*(int *)((long)entry + 0xcc) != 5) && ((*(byte *)((long)entry + 0xd8) & 2) == 0)) &&
     (*(int *)((long)ptr + 0x10) < iVar1)) {
    if (*(long *)((long)entry + 0x88) != 0) {
      __assert_fail("stream->closed_next == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0xaef,"int find_stream_on_goaway_func(void *, void *)");
    }
    if (*(long *)((long)entry + 0x80) != 0) {
      __assert_fail("stream->closed_prev == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0xaf0,"int find_stream_on_goaway_func(void *, void *)");
    }
    if (*(long *)((long)ptr + 8) != 0) {
      *(long *)((long)entry + 0x88) = *(long *)((long)ptr + 8);
    }
    *(void **)((long)ptr + 8) = entry;
  }
  return 0;
}

Assistant:

static int find_stream_on_goaway_func(void *entry, void *ptr) {
  nghttp2_close_stream_on_goaway_arg *arg;
  nghttp2_stream *stream;

  arg = (nghttp2_close_stream_on_goaway_arg *)ptr;
  stream = (nghttp2_stream *)entry;

  if (nghttp2_session_is_my_stream_id(arg->session, stream->stream_id)) {
    if (arg->incoming) {
      return 0;
    }
  } else if (!arg->incoming) {
    return 0;
  }

  if (stream->state != NGHTTP2_STREAM_IDLE &&
      (stream->flags & NGHTTP2_STREAM_FLAG_CLOSED) == 0 &&
      stream->stream_id > arg->last_stream_id) {
    /* We are collecting streams to close because we cannot call
       nghttp2_session_close_stream() inside nghttp2_map_each().
       Reuse closed_next member.. bad choice? */
    assert(stream->closed_next == NULL);
    assert(stream->closed_prev == NULL);

    if (arg->head) {
      stream->closed_next = arg->head;
      arg->head = stream;
    } else {
      arg->head = stream;
    }
  }

  return 0;
}